

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyboard.c
# Opt level: O0

void __thiscall read_config(VCONTROLLER *this,char *config_path)

{
  int iVar1;
  undefined8 in_RSI;
  long in_RDI;
  ALLEGRO_CONFIG *c;
  int def [3];
  char tmp [64];
  int i;
  long local_70;
  int def_00;
  undefined4 uVar2;
  undefined4 uVar3;
  char *in_stack_ffffffffffffffa8;
  ALLEGRO_CONFIG *in_stack_ffffffffffffffb0;
  uint local_14;
  
  def_00 = 0x52;
  uVar2 = 0x53;
  uVar3 = 0x4b;
  local_70 = al_load_config_file(in_RSI);
  if (local_70 == 0) {
    local_70 = al_create_config();
  }
  for (local_14 = 0; (int)local_14 < 3; local_14 = local_14 + 1) {
    snprintf(&stack0xffffffffffffffa8,0x40,"button%d",(ulong)local_14);
    iVar1 = get_config_int(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                           (char *)CONCAT44(uVar3,uVar2),def_00);
    *(int *)(*(long *)(in_RDI + 0x20) + (long)(int)local_14 * 4) = iVar1;
  }
  al_destroy_config(local_70);
  return;
}

Assistant:

static void read_config(VCONTROLLER * this, const char *config_path)
{
   int i;
   char tmp[64];
   int def[] = {
      ALLEGRO_KEY_LEFT,
      ALLEGRO_KEY_RIGHT,
      ALLEGRO_KEY_SPACE
   };

   ALLEGRO_CONFIG *c = al_load_config_file(config_path);
   if (!c) c = al_create_config();

   for (i = 0; i < 3; i++) {
      snprintf(tmp, sizeof(tmp), "button%d", i);
      ((int *)(this->private_data))[i] =
         get_config_int(c, "KEYBOARD", tmp, def[i]);
   }

   al_destroy_config(c);
}